

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

string * __thiscall
soul::AST::ProcessorInstance::getReadableName_abi_cxx11_
          (string *__return_storage_ptr__,ProcessorInstance *this)

{
  Expression *pEVar1;
  ProcessorBase *pPVar2;
  UnqualifiedName *this_00;
  string *psVar3;
  pool_ptr<soul::AST::ProcessorBase> *this_01;
  pool_ptr<soul::AST::ProcessorBase> target;
  pool_ptr<soul::AST::ProcessorBase> original;
  pool_ptr<soul::AST::ProcessorBase> local_28;
  pool_ptr<soul::AST::ProcessorBase> local_20;
  
  this_01 = &local_28;
  if (((this->implicitInstanceSource).object != (SharedEndpoint *)0x0) &&
     ((this->targetProcessor).object != (Expression *)0x0)) {
    pEVar1 = pool_ptr<soul::AST::Expression>::operator->(&this->targetProcessor);
    (*(pEVar1->super_Statement).super_ASTObject._vptr_ASTObject[6])(&local_28,pEVar1);
    if (local_28.object != (ProcessorBase *)0x0) {
      pPVar2 = pool_ptr<soul::AST::ProcessorBase>::operator->(&local_28);
      local_20.object = (pPVar2->originalBeforeSpecialisation).object;
      if (local_20.object != (ProcessorBase *)0x0) {
        this_01 = &local_20;
      }
      pPVar2 = pool_ptr<soul::AST::ProcessorBase>::operator->(this_01);
      psVar3 = Identifier::toString_abi_cxx11_(&(pPVar2->super_ModuleBase).name);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
      return __return_storage_ptr__;
    }
  }
  this_00 = pool_ptr<soul::AST::UnqualifiedName>::operator->(&this->instanceName);
  UnqualifiedName::toString_abi_cxx11_(__return_storage_ptr__,this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string getReadableName() const
        {
            if (isImplicitlyCreated() && targetProcessor != nullptr)
            {
                if (auto target = targetProcessor->getAsProcessor())
                {
                    if (auto original = target->originalBeforeSpecialisation)
                        return original->name.toString();

                    return target->name.toString();
                }
            }

            return instanceName->toString();
        }